

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O2

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_scalar_div
          (vector<__int128,_std::allocator<__int128>_> *__return_storage_ptr__,reed_solomn *this,
          vector<__int128,_std::allocator<__int128>_> *A,ll128 scalar)

{
  pointer p_Var1;
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 b [16];
  reed_solomn *in_RCX;
  reed_solomn *prVar2;
  undefined8 in_R8;
  long lVar3;
  int i;
  ulong uVar4;
  vector<__int128,_std::allocator<__int128>_> res;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 local_78 [16];
  pointer local_68;
  ll128 *local_58 [2];
  _Vector_base<__int128,_std::allocator<__int128>_> local_48;
  
  local_68 = (pointer)0x0;
  local_78._0_8_ = (_func_int **)0x0;
  local_78._8_8_ = (pointer)0x0;
  lVar3 = 0;
  for (uVar4 = 0;
      p_Var1 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)p_Var1 >> 4);
      uVar4 = uVar4 + 1) {
    prVar2 = *(reed_solomn **)((long)p_Var1 + lVar3);
    a._8_8_ = __return_storage_ptr__;
    a._0_8_ = in_stack_ffffffffffffff68;
    base_inverse((ll128 *)this,in_RCX,(ll128)a);
    a_00._8_8_ = __return_storage_ptr__;
    a_00._0_8_ = in_stack_ffffffffffffff68;
    b._8_8_ = in_R8;
    b._0_8_ = in_RCX;
    local_58[0] = base_mul((ll128 *)this,prVar2,(ll128)a_00,(ll128)b);
    std::vector<__int128,_std::allocator<__int128>_>::emplace_back<__int128>
              ((vector<__int128,_std::allocator<__int128>_> *)local_78,(__int128 *)local_58);
    lVar3 = lVar3 + 0x10;
  }
  prVar2 = (reed_solomn *)local_78;
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)&local_48,
             (vector<__int128,_std::allocator<__int128>_> *)prVar2);
  poly_strip(__return_storage_ptr__,prVar2,(vector<__int128,_std::allocator<__int128>_> *)&local_48)
  ;
  std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base(&local_48);
  std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base
            ((_Vector_base<__int128,_std::allocator<__int128>_> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

vector<ll128> reed_solomn::poly_scalar_div(vector<ll128> A, ll128 scalar) {
    vector<ll128> res;
    for (int i = 0; i < A.size(); ++i) {
        res.push_back(base_mul(A[i], base_inverse(scalar)));
    }
    return poly_strip(res);
}